

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O2

Gia_Man_t * Gia_MiniAigReduce(Mini_Aig_t *p,int *pEquivs)

{
  int nObjsMax;
  int iVar1;
  int iVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Vec_Int_t *p_01;
  Gia_Man_t *pGVar4;
  long lVar5;
  
  nObjsMax = p->nSize / 2;
  p_00 = Gia_ManStart(nObjsMax);
  pcVar3 = Abc_UtilStrsav("MiniAig");
  p_00->pName = pcVar3;
  p_01 = Vec_IntAlloc(nObjsMax);
  Vec_IntPush(p_01,0);
  Gia_ManHashAlloc(p_00);
  lVar5 = 1;
  do {
    if (nObjsMax <= lVar5) {
      Gia_ManHashStop(p_00);
      if (p_01->nSize == nObjsMax) {
        Vec_IntFree(p_01);
        Gia_ManSetRegNum(p_00,p->nRegs);
        pGVar4 = Gia_ManSeqCleanup(p_00);
        Gia_ManStop(p_00);
        return pGVar4;
      }
      __assert_fail("Vec_IntSize(vCopies) == nNodes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                    ,0x2c5,"Gia_Man_t *Gia_MiniAigReduce(Mini_Aig_t *, int *)");
    }
    iVar2 = (int)lVar5;
    iVar1 = Mini_AigNodeIsPi(p,iVar2);
    if (iVar1 == 0) {
      pGVar4 = (Gia_Man_t *)p;
      iVar1 = Mini_AigNodeIsPo(p,iVar2);
      if (iVar1 == 0) {
        pGVar4 = (Gia_Man_t *)p;
        iVar1 = Mini_AigNodeIsAnd(p,iVar2);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                        ,0x2bf,"Gia_Man_t *Gia_MiniAigReduce(Mini_Aig_t *, int *)");
        }
        iVar1 = Gia_ObjFromMiniFanin0Copy(pGVar4,p_01,p,iVar2);
        iVar2 = Gia_ObjFromMiniFanin1Copy(pGVar4,p_01,p,iVar2);
        iVar1 = Gia_ManHashAnd(p_00,iVar1,iVar2);
      }
      else {
        iVar1 = Gia_ObjFromMiniFanin0Copy(pGVar4,p_01,p,iVar2);
        iVar1 = Gia_ManAppendCo(p_00,iVar1);
      }
    }
    else {
      iVar1 = Gia_ManAppendCi(p_00);
    }
    if (pEquivs[lVar5] != -1) {
      iVar1 = Abc_Lit2Var(pEquivs[lVar5]);
      iVar1 = Vec_IntEntry(p_01,iVar1);
      iVar2 = Abc_LitIsCompl(pEquivs[lVar5]);
      iVar1 = Abc_LitNotCond(iVar1,iVar2);
    }
    Vec_IntPush(p_01,iVar1);
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_MiniAigReduce( Mini_Aig_t * p, int * pEquivs )
{
    Gia_Man_t * pGia, * pTemp;
    Vec_Int_t * vCopies;
    int i, iGiaLit = 0, nNodes;
    // get the number of nodes
    nNodes = Mini_AigNodeNum(p);
    // create ABC network
    pGia = Gia_ManStart( nNodes );
    pGia->pName = Abc_UtilStrsav( "MiniAig" );
    // create mapping from MiniAIG objects into ABC objects
    vCopies = Vec_IntAlloc( nNodes );
    Vec_IntPush( vCopies, 0 );
    // iterate through the objects
    Gia_ManHashAlloc( pGia );
    for ( i = 1; i < nNodes; i++ )
    {
        if ( Mini_AigNodeIsPi( p, i ) )
            iGiaLit = Gia_ManAppendCi(pGia);
        else if ( Mini_AigNodeIsPo( p, i ) )
            iGiaLit = Gia_ManAppendCo(pGia, Gia_ObjFromMiniFanin0Copy(pGia, vCopies, p, i));
        else if ( Mini_AigNodeIsAnd( p, i ) )
            iGiaLit = Gia_ManHashAnd(pGia, Gia_ObjFromMiniFanin0Copy(pGia, vCopies, p, i), Gia_ObjFromMiniFanin1Copy(pGia, vCopies, p, i));
        else assert( 0 );
        if ( pEquivs[i] != -1 )
            iGiaLit = Abc_LitNotCond( Vec_IntEntry(vCopies, Abc_Lit2Var(pEquivs[i])), Abc_LitIsCompl(pEquivs[i]) );
        Vec_IntPush( vCopies, iGiaLit );
    }
    Gia_ManHashStop( pGia );
    assert( Vec_IntSize(vCopies) == nNodes );
    Vec_IntFree( vCopies );
    Gia_ManSetRegNum( pGia, Mini_AigRegNum(p) );
    pGia = Gia_ManSeqCleanup( pTemp = pGia );
    Gia_ManStop( pTemp );
    return pGia;
}